

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O1

QDebug qt_QMetaEnum_debugOperator(QDebug *dbg,qint64 value,QMetaObject *meta,char *name)

{
  int *piVar1;
  char *pcVar2;
  uint uVar3;
  Stream *pSVar4;
  bool bVar5;
  int index;
  char *pcVar6;
  qsizetype qVar7;
  char *pcVar8;
  QString *pQVar9;
  QString *pQVar10;
  QTextStream *pQVar11;
  char *in_R8;
  char16_t *str;
  long in_FS_OFFSET;
  QStringView string;
  QStringView string_00;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QDebugStateSaver saver;
  QMetaEnum local_68;
  QDebugStateSaver local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  pQVar9 = (QString *)name;
  QDebugStateSaver::QDebugStateSaver(&local_58,(QDebug *)value);
  *(undefined1 *)(*(long *)value + 0x30) = 0;
  local_68.data.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.mobj = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
  index = QMetaObject::indexOfEnumerator((QMetaObject *)name,in_R8);
  local_68 = QMetaObject::enumerator((QMetaObject *)name,index);
  uVar3 = *(uint *)(*(long *)value + 0x34);
  if ((1 < (int)uVar3) && (pcVar6 = QMetaEnum::scope(&local_68), pcVar6 != (char *)0x0)) {
    pQVar11 = *(QTextStream **)value;
    pQVar10 = (QString *)0xffffffffffffffff;
    do {
      pcVar8 = pcVar6 + 1 + (long)pQVar10;
      pQVar10 = (QString *)((long)&(pQVar10->d).d + 1);
    } while (*pcVar8 != '\0');
    ba.m_data = (storage_type *)pQVar9;
    ba.m_size = (qsizetype)pcVar6;
    QString::fromUtf8(&local_50,pQVar10,ba);
    QTextStream::operator<<(pQVar11,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(*(QTextStream **)value,' ');
    }
    pQVar11 = *(QTextStream **)value;
    qVar7 = QtPrivate::qustrlen(L"::");
    string.m_data = L"::";
    string.m_size = qVar7;
    QTextStream::operator<<(pQVar11,string);
    if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(*(QTextStream **)value,' ');
    }
  }
  pcVar6 = QMetaEnum::valueToKey(&local_68,(long)(int)meta);
  bVar5 = QMetaEnum::isScoped(&local_68);
  if ((pcVar6 == (char *)0x0) || ((uVar3 & 1) != 0 || bVar5)) {
    pcVar8 = QMetaEnum::enumName(&local_68);
    if (pcVar8 == (char *)0x0) {
      pQVar10 = (QString *)0x0;
    }
    else {
      pQVar10 = (QString *)0xffffffffffffffff;
      do {
        pQVar9 = (QString *)((long)&(pQVar10->d).d + 1);
        pcVar2 = pcVar8 + 1 + (long)pQVar10;
        pQVar10 = pQVar9;
      } while (*pcVar2 != '\0');
    }
    pQVar11 = *(QTextStream **)value;
    ba_00.m_data = (storage_type *)pQVar9;
    ba_00.m_size = (qsizetype)pcVar8;
    QString::fromUtf8(&local_50,pQVar10,ba_00);
    QTextStream::operator<<(pQVar11,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(*(QTextStream **)value,' ');
    }
    str = L"::";
    if (pcVar6 == (char *)0x0) {
      str = L"(";
    }
    pQVar11 = *(QTextStream **)value;
    qVar7 = QtPrivate::qustrlen(str);
    string_00.m_data = str;
    string_00.m_size = qVar7;
    QTextStream::operator<<(pQVar11,string_00);
    if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(*(QTextStream **)value,' ');
    }
  }
  pQVar11 = *(QTextStream **)value;
  if (pcVar6 == (char *)0x0) {
    QTextStream::operator<<(pQVar11,(qlonglong)meta);
    if (*(char *)&(*(QTextStream **)value)[3]._vptr_QTextStream == '\x01') {
      QTextStream::operator<<(*(QTextStream **)value,' ');
    }
    QTextStream::operator<<(*(QTextStream **)value,')');
    pQVar11 = *(QTextStream **)value;
    if (*(char *)&pQVar11[3]._vptr_QTextStream != '\x01') goto LAB_00224b48;
  }
  else {
    pQVar10 = (QString *)0xffffffffffffffff;
    do {
      pcVar8 = pcVar6 + 1 + (long)pQVar10;
      pQVar10 = (QString *)((long)&(pQVar10->d).d + 1);
    } while (*pcVar8 != '\0');
    ba_01.m_data = (storage_type *)pQVar9;
    ba_01.m_size = (qsizetype)pcVar6;
    QString::fromUtf8(&local_50,pQVar10,ba_01);
    QTextStream::operator<<(pQVar11,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar11 = *(QTextStream **)value;
    if (*(char *)&pQVar11[3]._vptr_QTextStream == '\0') goto LAB_00224b48;
  }
  QTextStream::operator<<(pQVar11,' ');
LAB_00224b48:
  pSVar4 = *(Stream **)value;
  dbg->stream = pSVar4;
  piVar1 = &pSVar4->ref;
  *piVar1 = *piVar1 + 1;
  QDebugStateSaver::~QDebugStateSaver(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)dbg;
}

Assistant:

QDebug qt_QMetaEnum_debugOperator(QDebug &dbg, qint64 value, const QMetaObject *meta, const char *name)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    QMetaEnum me = meta->enumerator(meta->indexOfEnumerator(name));

    const int verbosity = dbg.verbosity();
    if (verbosity >= QDebug::DefaultVerbosity) {
        if (const char *scope = me.scope())
            dbg << scope << u"::";
    }

    const char *key = me.valueToKey(static_cast<int>(value));
    const bool scoped = me.isScoped() || verbosity & 1;
    if (scoped || !key)
        dbg << me.enumName() << (!key ? u"(" : u"::");

    if (key)
        dbg << key;
    else
        dbg << value << ')';

    return dbg;
}